

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

int xmlVSetError(xmlError *err,void *ctxt,xmlNodePtr node,int domain,int code,xmlErrorLevel level,
                char *file,int line,char *str1,char *str2,char *str3,int int1,int col,char *fmt,
                __va_list_tag *ap)

{
  int iVar1;
  xmlChar *pxStack_68;
  int res;
  xmlChar *tmp;
  char *str3Copy;
  char *str2Copy;
  char *str1Copy;
  char *fileCopy;
  char *message;
  int local_30;
  xmlErrorLevel level_local;
  int code_local;
  int domain_local;
  xmlNodePtr node_local;
  void *ctxt_local;
  xmlError *err_local;
  
  fileCopy = (char *)0x0;
  str1Copy = (char *)0x0;
  str2Copy = (char *)0x0;
  str3Copy = (char *)0x0;
  tmp = (xmlChar *)0x0;
  message._4_4_ = level;
  local_30 = code;
  level_local = domain;
  _code_local = node;
  node_local = (xmlNodePtr)ctxt;
  ctxt_local = err;
  if (code == 0) {
    xmlResetError(err);
    return 0;
  }
  if (fmt == (char *)0x0) {
    fileCopy = (*xmlMemStrdup)("No error message provided");
  }
  else {
    iVar1 = xmlStrVASPrintf(&stack0xffffffffffffff98,64000,fmt,ap);
    if (iVar1 < 0) goto LAB_00133241;
    fileCopy = (char *)pxStack_68;
  }
  if ((((fileCopy != (char *)0x0) &&
       ((file == (char *)0x0 ||
        (str1Copy = (char *)xmlStrdup((xmlChar *)file), (xmlChar *)str1Copy != (xmlChar *)0x0)))) &&
      ((str1 == (char *)0x0 ||
       (str2Copy = (char *)xmlStrdup((xmlChar *)str1), (xmlChar *)str2Copy != (xmlChar *)0x0)))) &&
     ((str2 == (char *)0x0 ||
      (str3Copy = (char *)xmlStrdup((xmlChar *)str2), (xmlChar *)str3Copy != (xmlChar *)0x0)))) {
    if ((str3 == (char *)0x0) || (tmp = xmlStrdup((xmlChar *)str3), tmp != (xmlChar *)0x0)) {
      xmlResetError((xmlErrorPtr)ctxt_local);
      *(xmlErrorLevel *)ctxt_local = level_local;
      *(int *)((long)ctxt_local + 4) = local_30;
      *(char **)((long)ctxt_local + 8) = fileCopy;
      *(xmlErrorLevel *)((long)ctxt_local + 0x10) = message._4_4_;
      *(char **)((long)ctxt_local + 0x18) = str1Copy;
      *(int *)((long)ctxt_local + 0x20) = line;
      *(char **)((long)ctxt_local + 0x28) = str2Copy;
      *(char **)((long)ctxt_local + 0x30) = str3Copy;
      *(xmlChar **)((long)ctxt_local + 0x38) = tmp;
      *(int *)((long)ctxt_local + 0x40) = int1;
      *(int *)((long)ctxt_local + 0x44) = col;
      *(xmlNodePtr *)((long)ctxt_local + 0x50) = _code_local;
      *(xmlNodePtr *)((long)ctxt_local + 0x48) = node_local;
      return 0;
    }
    tmp = (xmlChar *)0x0;
  }
LAB_00133241:
  (*xmlFree)(fileCopy);
  (*xmlFree)(str1Copy);
  (*xmlFree)(str2Copy);
  (*xmlFree)(str3Copy);
  (*xmlFree)(tmp);
  return -1;
}

Assistant:

static int
xmlVSetError(xmlError *err,
             void *ctxt, xmlNodePtr node,
             int domain, int code, xmlErrorLevel level,
             const char *file, int line,
             const char *str1, const char *str2, const char *str3,
             int int1, int col,
             const char *fmt, va_list ap)
{
    char *message = NULL;
    char *fileCopy = NULL;
    char *str1Copy = NULL;
    char *str2Copy = NULL;
    char *str3Copy = NULL;

    if (code == XML_ERR_OK) {
        xmlResetError(err);
        return(0);
    }

    /*
     * Formatting the message
     */
    if (fmt == NULL) {
        message = xmlMemStrdup("No error message provided");
    } else {
        xmlChar *tmp;
        int res;

        res = xmlStrVASPrintf(&tmp, MAX_ERR_MSG_SIZE, fmt, ap);
        if (res < 0)
            goto err_memory;
        message = (char *) tmp;
    }
    if (message == NULL)
        goto err_memory;

    if (file != NULL) {
        fileCopy = (char *) xmlStrdup((const xmlChar *) file);
        if (fileCopy == NULL)
            goto err_memory;
    }
    if (str1 != NULL) {
        str1Copy = (char *) xmlStrdup((const xmlChar *) str1);
        if (str1Copy == NULL)
            goto err_memory;
    }
    if (str2 != NULL) {
        str2Copy = (char *) xmlStrdup((const xmlChar *) str2);
        if (str2Copy == NULL)
            goto err_memory;
    }
    if (str3 != NULL) {
        str3Copy = (char *) xmlStrdup((const xmlChar *) str3);
        if (str3Copy == NULL)
            goto err_memory;
    }

    xmlResetError(err);

    err->domain = domain;
    err->code = code;
    err->message = message;
    err->level = level;
    err->file = fileCopy;
    err->line = line;
    err->str1 = str1Copy;
    err->str2 = str2Copy;
    err->str3 = str3Copy;
    err->int1 = int1;
    err->int2 = col;
    err->node = node;
    err->ctxt = ctxt;

    return(0);

err_memory:
    xmlFree(message);
    xmlFree(fileCopy);
    xmlFree(str1Copy);
    xmlFree(str2Copy);
    xmlFree(str3Copy);
    return(-1);
}